

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O3

void __thiscall
Test_Template_StringCacheKey::Test_Template_StringCacheKey(Test_Template_StringCacheKey *this)

{
  _func_void *local_8;
  
  local_8 = Run;
  if (g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<void(*)(),std::allocator<void(*)()>>::_M_realloc_insert<void(*)()>
              ((vector<void(*)(),std::allocator<void(*)()>> *)&g_testlist,
               (iterator)
               g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_8);
  }
  else {
    *g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
     super__Vector_impl_data._M_finish = Run;
    g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
    super__Vector_impl_data._M_finish =
         g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  return;
}

Assistant:

TEST(Template, StringCacheKey) {
  // If you use these same cache keys somewhere else,
  // call Template::ClearCache first.
  const string cache_key_a = "cache key a";
  const string text = "Test template 1";
  TemplateDictionary empty_dict("dict");

  // When a string template is registered via StringToTemplateCache,
  // we can use GetTemplate for that same cache-key under any other
  // Strip because we cache the contents.
  Template *tpl1, *tpl2;
  ASSERT(Template::StringToTemplateCache(cache_key_a, text));
  tpl1 = Template::GetTemplate(cache_key_a, DO_NOT_STRIP);
  AssertExpandIs(tpl1, &empty_dict, text, true);

  // Different strip.
  ASSERT(tpl2 = Template::GetTemplate(cache_key_a, STRIP_BLANK_LINES));
  ASSERT(tpl2 != tpl1);
  AssertExpandIs(tpl2, &empty_dict, text, true);

  Template::ClearCache();
}